

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::Subst_Forward(TPZFrontMatrix<std::complex<double>,_TPZFileEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                *this,TPZFMatrix<std::complex<double>_> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00005294;
  TPZFMatrix<std::complex<double>_> *in_stack_00005298;
  TPZFileEqnStorage<std::complex<double>_> *in_stack_000052a0;
  
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFrontSym<std::complex<double>_>::GetDecomposeType
            ((TPZFrontSym<std::complex<double>_> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<std::complex<double>_>::Forward
            (in_stack_000052a0,in_stack_00005298,in_stack_00005294);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}